

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O3

int main(int argc,char **argv)

{
  Api AVar1;
  pointer *ppAVar2;
  char *__s1;
  pointer __nptr;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  Api *pAVar6;
  undefined8 uVar7;
  pointer *ppAVar8;
  char *pcVar9;
  long lVar10;
  char **ppcVar11;
  size_t i;
  bool bVar12;
  double dVar13;
  allocator local_79;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> local_78;
  undefined8 uStack_60;
  double local_58;
  Api *local_50 [2];
  Api local_40 [4];
  
  setlocale(6,(char *)"");
  lVar10 = 0;
  do {
    pcVar9 = "/usr/local/share/locale/";
    bindtextdomain(*(undefined8 *)((long)&PTR_anon_var_dwarf_5213_002181c0 + lVar10));
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  textdomain("adljack");
  Midi_Db::init(&midi_db,(EVP_PKEY_CTX *)pcVar9);
  pcVar9 = getenv("HOME");
  if (pcVar9 != (char *)0x0) {
    local_50[0] = local_40;
    sVar4 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar9,pcVar9 + sVar4);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
    ppAVar2 = &local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pAVar6 = (Api *)(puVar5 + 2);
    if ((pointer *)*puVar5 == (pointer *)pAVar6) {
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)pAVar6;
      uStack_60 = puVar5[3];
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppAVar2;
    }
    else {
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)pAVar6;
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar5;
    }
    local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar5[1];
    *puVar5 = pAVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&arg_config_file_abi_cxx11_,(string *)&local_78);
    if ((pointer *)
        local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
        super__Vector_impl_data._M_start != ppAVar2) {
      operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  iVar3 = generic_getopt(argc,argv,"L:A:M:C",usage);
  pcVar9 = (char *)arg_config_file_abi_cxx11_._M_string_length;
  __s1 = _optarg;
  do {
    arg_config_file_abi_cxx11_._M_string_length = (size_type)pcVar9;
    _optarg = __s1;
    if (iVar3 == -1) {
      iVar3 = 1;
      if (_optind == argc) {
        load_config();
        openlog("ADLrt",0,8);
        handle_signals();
        iVar3 = audio_main();
      }
      return iVar3;
    }
    if (iVar3 < 0x4c) {
      if (iVar3 == 0x41) {
        ppcVar11 = audio_api_ids;
        lVar10 = 0;
        do {
          iVar3 = strcmp(__s1,*ppcVar11);
          if (iVar3 == 0) goto LAB_00113be6;
          lVar10 = lVar10 + 1;
          ppcVar11 = ppcVar11 + 1;
        } while (lVar10 != 10);
        lVar10 = 0;
LAB_00113be6:
        local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
        super__Vector_impl_data._M_finish = (Api *)0x0;
        local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        arg_audio_api = (Api)lVar10;
        RtAudio::getCompiledApi(&local_78);
        ppAVar2 = (pointer *)
                  local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar12 = false;
        }
        else {
          do {
            ppAVar8 = (pointer *)((long)ppAVar2 + 4);
            bVar12 = *(Api *)ppAVar2 == (Api)lVar10;
            if (bVar12) break;
            ppAVar2 = ppAVar8;
          } while (ppAVar8 !=
                   (pointer *)
                   local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if ((pointer *)
            local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar12) {
          main_cold_2();
          return 1;
        }
      }
      else {
        if (iVar3 != 0x43) {
LAB_00113d57:
          usage();
          return 1;
        }
        strlen(__s1);
        std::__cxx11::string::_M_replace(0x21d3e8,0,pcVar9,(ulong)__s1);
      }
    }
    else if (iVar3 == 0x4c) {
      std::__cxx11::string::string((string *)&local_78,__s1,&local_79);
      __nptr = local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar6 = (Api *)__errno_location();
      AVar1 = *pAVar6;
      *pAVar6 = UNSPECIFIED;
      dVar13 = strtod((char *)__nptr,(char **)local_50);
      if (local_50[0] == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_00113d91:
        uVar7 = std::__throw_out_of_range("stod");
        if (local_50[0] != pAVar6) {
          operator_delete(local_50[0]);
        }
        _Unwind_Resume(uVar7);
      }
      if (*pAVar6 == UNSPECIFIED) {
        *pAVar6 = AVar1;
      }
      else if (*pAVar6 == 0x22) goto LAB_00113d91;
      arg_latency = dVar13 * 0.001;
      dVar13 = arg_latency;
      if ((pointer *)
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        local_58 = arg_latency;
        operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        dVar13 = local_58;
      }
      if (dVar13 <= 0.0) {
        main_cold_3();
        return 1;
      }
    }
    else {
      if (iVar3 != 0x4d) goto LAB_00113d57;
      ppcVar11 = midi_api_ids;
      lVar10 = 0;
      do {
        iVar3 = strcmp(__s1,*ppcVar11);
        if (iVar3 == 0) goto LAB_00113b58;
        lVar10 = lVar10 + 1;
        ppcVar11 = ppcVar11 + 1;
      } while (lVar10 != 9);
      lVar10 = 0;
LAB_00113b58:
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_finish = (Api *)0x0;
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      arg_midi_api = (Api)lVar10;
      RtMidi::getCompiledApi((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)&local_78);
      ppAVar2 = (pointer *)
                local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar12 = false;
      }
      else {
        do {
          ppAVar8 = (pointer *)((long)ppAVar2 + 4);
          bVar12 = *(Api *)ppAVar2 == (Api)lVar10;
          if (bVar12) break;
          ppAVar2 = ppAVar8;
        } while (ppAVar8 !=
                 (pointer *)
                 local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if ((pointer *)
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar12) {
        main_cold_1();
        return 1;
      }
    }
    iVar3 = generic_getopt(argc,argv,"L:A:M:C",usage);
    pcVar9 = (char *)arg_config_file_abi_cxx11_._M_string_length;
    __s1 = _optarg;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    i18n_setup();
    midi_db.init();

    char *home_dir = getenv("HOME");
    if (home_dir) {
        arg_config_file = std::string(home_dir) + "/.config/adlrt.conf";
    }

    for (int c; (c = generic_getopt(argc, argv, "L:A:M:C", usage)) != -1;) {
        switch (c) {
        case 'C' : {
            ::arg_config_file = optarg;
            break;
        }
        case 'L': {
            double latency = ::arg_latency = std::stod(optarg) * 1e-3;
            if (latency <= 0) {
                fprintf(stderr, "%s\n", _("Invalid latency."));
                return 1;
            }
            break;
        }
        case 'A': {
            RtAudio::Api audio_api = ::arg_audio_api = find_audio_api(optarg);
            if (!is_compiled_audio_api(audio_api)) {
                fprintf(stderr, _("Invalid audio system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        case 'M': {
            RtMidi::Api midi_api = ::arg_midi_api = find_midi_api(optarg);
            if (!is_compiled_midi_api(midi_api)) {
                fprintf(stderr, _("Invalid MIDI system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        default:
            usage();
            return 1;
        }
    }

    if (argc != optind)
        return 1;

    load_config();

#ifdef ADLJACK_GTK3
    gtk_init(&argc, &argv);
#endif

#if !defined(_WIN32)
    openlog("ADLrt", 0, LOG_USER);
#endif

    handle_signals();
    return audio_main();
}